

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O0

string * rcg::storeImageAsDisparityPFM(string *name,Image *image,int inv,float scale,float offset)

{
  char cVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  void *this;
  Image *in_RDX;
  string *in_RDI;
  float in_XMM0_Da;
  char *c;
  float d;
  int val;
  size_t i;
  size_t k;
  char *cc;
  int pp;
  bool msbfirst;
  streambuf *sb;
  ofstream out;
  string *in_stack_000000e8;
  uchar *p;
  size_t height;
  size_t width;
  size_t px;
  string *full_name;
  byte local_3a1;
  char *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc78;
  IOException *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  ulong local_318;
  ulong local_310;
  ostream local_2f0 [512];
  string local_f0 [39];
  byte local_c9;
  uint8_t *local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [35];
  undefined1 local_7d;
  allocator local_69;
  string local_68 [72];
  float local_20;
  Image *local_18;
  
  local_20 = in_XMM0_Da;
  local_18 = in_RDX;
  uVar2 = Image::getPixelFormat(in_RDX);
  if (uVar2 != 0x11000b8) {
    local_7d = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ",&local_69);
    uVar2 = Image::getPixelFormat(local_18);
    GetPixelFormatName((PfncFormat)uVar2);
    std::operator+(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    anon_unknown_1::IOException::IOException(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_7d = 0;
    __cxa_throw(uVar3,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  if ((local_20 == 0.0) && (!NAN(local_20))) {
    local_a2 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"storeImageAsDisparityPFM(): Scale must not be 0!",&local_a1);
    anon_unknown_1::IOException::IOException(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_a2 = 0;
    __cxa_throw(uVar3,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  local_b0 = Image::getXPadding(local_18);
  local_b8 = Image::getWidth(local_18);
  local_c0 = Image::getHeight(local_18);
  local_c8 = Image::getPixels((Image *)0x16ec43);
  local_c8 = local_c8 + (local_b8 + local_b0) * (local_c0 + 1) * 2;
  local_c9 = 0;
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  ensureNewFileName(in_stack_000000e8);
  std::__cxx11::string::~string(local_f0);
  std::ofstream::ofstream(local_2f0,in_RDI,_S_bin);
  poVar4 = std::operator<<(local_2f0,"Pf");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(local_2f0,local_b8);
  poVar4 = std::operator<<(poVar4," ");
  this = (void *)std::ostream::operator<<(poVar4,local_c0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(local_2f0,1);
  std::operator<<(poVar4,"\n");
  cVar1 = std::ofstream::rdbuf();
  local_310 = 0;
  while( true ) {
    local_3a1 = 0;
    if (local_310 < local_c0) {
      local_3a1 = std::ios::good();
    }
    if ((local_3a1 & 1) == 0) break;
    local_c8 = local_c8 + (local_b8 + local_b0) * -4;
    for (local_318 = 0; local_318 < local_b8; local_318 = local_318 + 1) {
      Image::isBigEndian(local_18);
      local_c8 = local_c8 + 2;
      std::numeric_limits<float>::infinity();
      std::streambuf::sputc(cVar1);
      std::streambuf::sputc(cVar1);
      std::streambuf::sputc(cVar1);
      std::streambuf::sputc(cVar1);
      local_c8 = local_c8 + local_b0;
    }
    local_310 = local_310 + 1;
  }
  std::ofstream::close();
  local_c9 = 1;
  std::ofstream::~ofstream(local_2f0);
  if ((local_c9 & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string storeImageAsDisparityPFM(const std::string &name, const Image &image, int inv,
  float scale, float offset)
{
  if (image.getPixelFormat() != Coord3D_C16)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ")+
      GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
  }

  if (scale == 0)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Scale must not be 0!"));
  }

  // convert values and store disparity image

  size_t px=image.getXPadding();
  size_t width=image.getWidth();
  size_t height=image.getHeight();
  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels())+
    2*(width+px)*(height+1);

  std::string full_name=ensureNewFileName(name+".pfm");
  std::ofstream out(full_name, std::ios::binary);

  out << "Pf" << std::endl;
  out << width << " " << height << std::endl;
  out << 1 << "\n";

  std::streambuf *sb=out.rdbuf();

  // get 16 bit data, scale and add offset and store as big endian

  bool msbfirst=true;

  {
    int pp=1;
    char *cc=reinterpret_cast<char *>(&pp);
    msbfirst=(cc[0] != 1);
  }

  for (size_t k=0; k<height && out.good(); k++)
  {
    p-=(width+px)<<2;
    for (size_t i=0; i<width; i++)
    {
      int val;
      if (image.isBigEndian())
      {
        val=(static_cast<int>(p[0])<<8)|p[1];
      }
      else
      {
        val=(static_cast<int>(p[1])<<8)|p[0];
      }

      p+=2;

      float d=std::numeric_limits<float>::infinity();
      if (val != inv)
      {
        d=static_cast<float>(val*scale+offset);
      }

      char *c=reinterpret_cast<char *>(&d);

      if (msbfirst)
      {
        sb->sputc(c[0]);
        sb->sputc(c[1]);
        sb->sputc(c[2]);
        sb->sputc(c[3]);
      }
      else
      {
        sb->sputc(c[3]);
        sb->sputc(c[2]);
        sb->sputc(c[1]);
        sb->sputc(c[0]);
      }

      p+=px;
    }
  }

  out.close();

  return full_name;
}